

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O2

int implementations::scheme::scheme_main(void)

{
  environment *this;
  undefined8 extraout_RAX;
  env_p global_env;
  allocator local_79;
  __shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2> local_78;
  env_p local_68;
  __shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2> local_48;
  string local_38;
  
  this = (environment *)operator_new(0x98);
  local_68.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  local_68.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  environment::environment(this,&local_68);
  std::__shared_ptr<implementations::scheme::environment,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<implementations::scheme::environment,void>
            ((__shared_ptr<implementations::scheme::environment,(__gnu_cxx::_Lock_policy)2> *)
             &local_78,this);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_68.
              super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_58,&local_78);
  add_globals(local_58._M_ptr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  std::__cxx11::string::string((string *)&local_38,"90> ",&local_79);
  std::__shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_48,&local_78);
  repl(&local_38,(env_p *)&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  std::__cxx11::string::~string((string *)&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int scheme_main()
{
	env_p global_env(new environment()); add_globals(global_env);
	repl("90> ", global_env);
	return 0;
}